

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystem.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::AcousticEmitterSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AcousticEmitterSystem *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Acoustic Emitter System:",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tName:     ",0xc);
  ENUMS::GetEnumAsStringAcousticSystemName_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui16EmitterName,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFunction: ",0xc);
  ENUMS::GetEnumAsStringAcousticSystemFunction_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui8Function,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tID:       ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString AcousticEmitterSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Acoustic Emitter System:"
       << "\n\tName:     " << GetEnumAsStringAcousticSystemName( m_ui16EmitterName )
       << "\n\tFunction: " << GetEnumAsStringAcousticSystemFunction( m_ui8Function )
       << "\n\tID:       " << ( KUINT16 )m_ui8EmitterIDNumber
       << "\n";

    return ss.str();
}